

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O1

EndpointInfo * __thiscall
helics::InterfaceInfo::getEndpoint(InterfaceInfo *this,InterfaceHandle handle)

{
  EndpointInfo *pEVar1;
  InterfaceHandle local_2c;
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  *local_28;
  unique_lock<std::shared_mutex> local_20;
  
  local_28 = &(this->endpoints).m_obj;
  local_20._M_device = &(this->endpoints).m_mutex;
  local_20._M_owns = false;
  local_2c.hid = handle.hid;
  std::unique_lock<std::shared_mutex>::lock(&local_20);
  local_20._M_owns = true;
  pEVar1 = gmlc::containers::
           DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
           ::find(local_28,&local_2c);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_20);
  return pEVar1;
}

Assistant:

EndpointInfo* InterfaceInfo::getEndpoint(InterfaceHandle handle)
{
    return endpoints.lock()->find(handle);
}